

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

char ** bcf_hdr_seqnames(bcf_hdr_t *h,int *n)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char **ppcVar4;
  uint local_34;
  khint_t k;
  char **names;
  int m;
  int tid;
  vdict_t *d;
  int *n_local;
  bcf_hdr_t *h_local;
  
  puVar3 = (uint *)h->dict[1];
  uVar1 = puVar3[1];
  ppcVar4 = (char **)calloc((long)(int)uVar1,8);
  local_34 = 0;
  do {
    if (*puVar3 <= local_34) {
      names._4_4_ = 0;
      while( true ) {
        if ((int)uVar1 <= names._4_4_) {
          *n = uVar1;
          return ppcVar4;
        }
        if (ppcVar4[names._4_4_] == (char *)0x0) break;
        names._4_4_ = names._4_4_ + 1;
      }
      __assert_fail("names[tid]",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0x548,"const char **bcf_hdr_seqnames(const bcf_hdr_t *, int *)");
    }
    if ((*(uint *)(*(long *)(puVar3 + 4) + (ulong)(local_34 >> 4) * 4) >>
         (sbyte)((local_34 & 0xf) << 1) & 3) == 0) {
      iVar2 = *(int *)(*(long *)(puVar3 + 8) + (ulong)local_34 * 0x30 + 0x28);
      if ((int)uVar1 <= iVar2) {
        __assert_fail("tid<m",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x543,"const char **bcf_hdr_seqnames(const bcf_hdr_t *, int *)");
      }
      ppcVar4[iVar2] = *(char **)(*(long *)(puVar3 + 6) + (ulong)local_34 * 8);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

const char **bcf_hdr_seqnames(const bcf_hdr_t *h, int *n)
{
    vdict_t *d = (vdict_t*)h->dict[BCF_DT_CTG];
    int tid, m = kh_size(d);
    const char **names = (const char**) calloc(m,sizeof(const char*));
    khint_t k;
    for (k=kh_begin(d); k<kh_end(d); k++)
    {
        if ( !kh_exist(d,k) ) continue;
        tid = kh_val(d,k).id;
        assert( tid<m );
        names[tid] = kh_key(d,k);
    }
    // sanity check: there should be no gaps
    for (tid=0; tid<m; tid++)
        assert(names[tid]);
    *n = m;
    return names;
}